

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> __thiscall
wabt::
MakeUnique<wabt::WastLexer,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>,wabt::string_view&>
          (wabt *this,unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *args,
          string_view *args_1)

{
  LexerSource *pLVar1;
  long lVar2;
  long *plVar3;
  string_view local_30;
  
  plVar3 = (long *)operator_new(0x58);
  pLVar1 = (args->_M_t).
           super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
           super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
           super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  (args->_M_t).super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl = (LexerSource *)0x0;
  local_30.data_ = args_1->data_;
  local_30.size_ = args_1->size_;
  *plVar3 = (long)pLVar1;
  string_view::operator_cast_to_string((string *)(plVar3 + 1),&local_30);
  *(undefined4 *)(plVar3 + 5) = 1;
  lVar2 = *(long *)*plVar3;
  plVar3[6] = lVar2;
  plVar3[7] = lVar2 + ((long *)*plVar3)[1];
  plVar3[8] = lVar2;
  plVar3[9] = lVar2;
  plVar3[10] = lVar2;
  *(long **)this = plVar3;
  return (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
         (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}